

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.h
# Opt level: O0

int CG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *residual,int64_t *max_iter,
              double *tol,int FromCurrent)

{
  ostream *poVar1;
  void *this;
  long *in_RCX;
  undefined8 in_RDX;
  TPZFMatrix<long_double> *in_RSI;
  long *in_RDI;
  TPZFMatrix<long_double> *in_R8;
  long *in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST6;
  longdouble in_ST7;
  REAL RVar5;
  REAL RVar6;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  TPZFMatrix<long_double> *r;
  TPZFMatrix<long_double> *res;
  TPZFMatrix<long_double> resbackup;
  REAL normb;
  REAL rho_1;
  REAL rho;
  REAL beta;
  REAL alpha;
  TPZFMatrix<long_double> q;
  TPZFMatrix<long_double> z;
  TPZFMatrix<long_double> p;
  double resid;
  undefined2 in_stack_fffffffffffffca0;
  undefined2 uVar7;
  undefined6 in_stack_fffffffffffffca2;
  undefined2 in_stack_fffffffffffffcb0;
  undefined6 in_stack_fffffffffffffcb2;
  TPZFMatrix<long_double> *in_stack_fffffffffffffcb8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  long local_2d8;
  TPZFMatrix<long_double> *local_2c0;
  TPZFMatrix<long_double> local_2b8;
  double local_228;
  double local_220;
  REAL local_218;
  double local_210;
  double local_208;
  TPZFMatrix<long_double> local_200;
  TPZFMatrix<long_double> local_160;
  TPZFMatrix<long_double> local_d0;
  double local_40;
  long *local_38;
  TPZFMatrix<long_double> *local_30;
  long *local_28;
  undefined8 local_20;
  TPZFMatrix<long_double> *local_18;
  long *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffcd0);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffcd0);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffcd0);
  local_220 = 0.0;
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0));
  uVar7 = (undefined2)((unkuint10)in_ST0 >> 0x40);
  lVar2 = in_ST7;
  local_228 = TPZExtractVal::val(in_ST0);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffcd0);
  local_2c0 = local_30;
  if (local_30 == (TPZFMatrix<long_double> *)0x0) {
    local_2c0 = &local_2b8;
  }
  if (in_stack_00000010 == 0) {
    (*(local_18->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])();
    TPZFMatrix<long_double>::operator=
              (in_stack_fffffffffffffcb8,
               (TPZFMatrix<long_double> *)
               CONCAT62(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0));
  }
  else {
    in_stack_fffffffffffffcb0 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
    uVar7 = (undefined2)((unkuint10)-(longdouble)1 >> 0x40);
    in_ST7 = in_ST6;
    lVar2 = in_ST6;
    (**(code **)(*local_10 + 0x138))(local_10,local_18,local_20,local_2c0,0);
  }
  if ((local_228 == 0.0) && (!NAN(local_228))) {
    local_228 = 1.0;
  }
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffffca2,uVar7));
  lVar3 = lVar2;
  RVar5 = TPZExtractVal::val(in_ST1);
  local_40 = RVar5 / local_228;
  if (*in_stack_00000008 < local_40) {
    for (local_2d8 = 1; local_2d8 <= *local_38; local_2d8 = local_2d8 + 1) {
      (**(code **)(*local_28 + 0x58))(local_28,local_2c0,&local_160,0);
      Dot<long_double>((TPZFMatrix<long_double> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd0);
      lVar4 = lVar3;
      local_218 = TPZExtractVal::val(in_ST2);
      if (local_2d8 == 1) {
        TPZFMatrix<long_double>::operator=
                  (in_stack_fffffffffffffcb8,
                   (TPZFMatrix<long_double> *)
                   CONCAT62(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0));
        in_ST2 = in_ST5;
        in_ST5 = lVar2;
      }
      else {
        local_210 = local_218 / local_220;
        lVar4 = lVar3;
        TPZFMatrix<long_double>::TimesBetaPlusZ(&local_d0,(longdouble)local_210,&local_160);
        in_ST2 = in_ST5;
        in_ST5 = lVar2;
      }
      (**(code **)(*local_10 + 0x128))(local_10,&local_d0,&local_200,0);
      RVar5 = local_218;
      Dot<long_double>((TPZFMatrix<long_double> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd0);
      RVar6 = TPZExtractVal::val(in_ST3);
      local_208 = RVar5 / RVar6;
      TPZFMatrix<long_double>::ZAXPY(local_18,(longdouble)local_208,&local_d0);
      uVar7 = (undefined2)((unkuint10)(longdouble)-local_208 >> 0x40);
      lVar2 = lVar4;
      TPZFMatrix<long_double>::ZAXPY(local_2c0,(longdouble)-local_208,&local_200);
      in_ST3 = in_ST6;
      in_ST6 = lVar3;
      Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffffca2,uVar7));
      in_stack_fffffffffffffcdc = SUB104(in_ST4,0);
      lVar3 = lVar2;
      RVar5 = TPZExtractVal::val(in_ST4);
      local_40 = RVar5 / local_228;
      if (local_40 <= *in_stack_00000008) {
        *in_stack_00000008 = local_40;
        *local_38 = local_2d8;
        local_4 = 0;
        goto LAB_012cd4bf;
      }
      local_220 = local_218;
      in_ST4 = in_ST7;
      in_ST7 = lVar4;
    }
    *in_stack_00000008 = local_40;
    poVar1 = std::operator<<((ostream *)&std::cout,"cg iter = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2d8);
    poVar1 = std::operator<<(poVar1," res = ");
    this = (void *)std::ostream::operator<<(poVar1,local_40);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    *in_stack_00000008 = local_40;
    *local_38 = 0;
    local_4 = 0;
  }
LAB_012cd4bf:
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cd4cc);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cd4d9);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cd4e6);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cd4f3);
  return local_4;
}

Assistant:

int
CG( Matrix &A, Vector &x, const Vector &b,
   Preconditioner &M, Vector *residual, int64_t &max_iter, Real &tol,const int FromCurrent)
{
	Real resid;
	Vector p, z, q;
	REAL alpha, beta, rho, rho_1 = 0;
	
    REAL normb = TPZExtractVal::val(Norm(b));
	Vector resbackup;
	Vector *res = residual;
	
#ifdef TEST
	std::list< TPZFMatrix<REAL> > plist,qlist;
	std::list< TPZFMatrix<REAL> >::iterator jt;
	std::list< TPZFMatrix<REAL> >::iterator kt;
	Vector Au;
#endif
	
	if(!res) res = &resbackup;
	Vector &r = *res;
	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    }
	else {
		x.Zero();
		r = b;
	}
	
	if (normb == 0.0)
		normb = 1.0;
	
    if ((resid = (TPZExtractVal::val( Norm(r) ) ) / normb) <= tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	int64_t i;
	for (i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
        rho = TPZExtractVal::val(Dot(r, z));
		
		if (i == 1)
			p = z;
		else {
			beta = rho / rho_1;
			p.TimesBetaPlusZ(beta,z);
		}
#ifdef TEST
		
		plist.push_back(p);
#endif	 
		
		A.Multiply(p,q);
		alpha = rho / (TPZExtractVal::val(Dot(p, q)));
		
#ifdef TEST
		qlist.push_back(q);
#endif
		
		x.ZAXPY(alpha,p);
		r.ZAXPY(-alpha,q);
		
#ifdef TEST
		A.Multiply(x,Au);
		REAL energy = Dot(x,Au)/2.-Dot(x,b);
#endif
		
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) <= tol) {
			tol = resid;
			max_iter = i;
#ifdef PZDEBUG
			std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
#endif
			return 0;
		}
#ifdef PZDEBUG
		std::cout << "cg iter = " << i <<  " res = " << resid /*<< " energy " << energy */ << std::endl;
#endif
#ifdef TEST
		std::cout << " energy " << energy << std::endl;
		TPZFMatrix<REAL> inner(plist.size(),plist.size(),0.);
		{
			int64_t j,k;
			for(j=0, jt = plist.begin(); jt != plist.end(); jt++,j++)
			{
				for(k=0, kt = qlist.begin(); kt != qlist.end(); kt++,k++)
				{
					inner(j,k) = Dot((*jt),(*kt));
				}
			}
		}
		inner.Print("Inner product of search directions");
#endif
		rho_1 = rho;
	}
	
	tol = resid;
	std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
	return 1;
}